

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.h
# Opt level: O3

void __thiscall
cmExportBuildFileGenerator::SetMakefile(cmExportBuildFileGenerator *this,cmMakefile *mf)

{
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> local_68;
  cmListFileBacktrace local_48;
  
  this->Makefile = mf;
  cmMakefile::GetBacktrace(&local_48,mf);
  local_68.super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
       super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector(&local_68);
  (this->Backtrace).Snapshot.Position.Position = local_48.Snapshot.Position.Position;
  (this->Backtrace).Snapshot.State = local_48.Snapshot.State;
  (this->Backtrace).Snapshot.Position.Tree = local_48.Snapshot.Position.Tree;
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void SetMakefile(cmMakefile *mf) {
    this->Makefile = mf;
    this->Backtrace = this->Makefile->GetBacktrace();
  }